

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

IXML_Attr * ixmlElement_getAttributeNode(IXML_Element *element,char *name)

{
  IXML_Attr *pIVar1;
  int iVar2;
  Nodeptr *pp_Var3;
  
  if (name != (char *)0x0 && element != (IXML_Element *)0x0) {
    pp_Var3 = &(element->n).firstAttr;
    while (pIVar1 = (IXML_Attr *)*pp_Var3, pIVar1 != (IXML_Attr *)0x0) {
      iVar2 = strcmp((pIVar1->n).nodeName,name);
      if (iVar2 == 0) {
        return pIVar1;
      }
      pp_Var3 = &(pIVar1->n).nextSibling;
    }
  }
  return (IXML_Attr *)0x0;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNode(
	IXML_Element *element, const DOMString name)
{
	IXML_Node *attrNode;

	if (element == NULL || name == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->nodeName, name) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}